

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void event_exercise_time(tgestate_t *state)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x6e8) = 0x28;
  set_route_go_to_yard_reversed((tgestate_t *)0x115dd9);
  return;
}

Assistant:

static void event_exercise_time(tgestate_t *state) // end of exercise time?
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  set_route_go_to_yard_reversed(state);
}